

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall
nn::ESoinn::trainOneEpoch
          (ESoinn *this,
          vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
          *points,bool train_first_layer,double threshold_second_layer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels)

{
  ConcreteLogger *pCVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
  *this_01;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  __shared_ptr<wv::AbstractWeightVector,_(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *p;
  const_reference pvVar6;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type local_2f8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string_type local_210;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string_type local_110;
  allocator local_e9;
  string local_e8;
  byte local_c2;
  allocator local_c1;
  string local_c0;
  uint local_a0;
  uint local_9c;
  uint32_t i_1;
  uint32_t iteration;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  value_type_conflict3 local_84;
  undefined1 local_80 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  allocator local_51;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels_local;
  double threshold_second_layer_local;
  vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
  *pvStack_18;
  bool train_first_layer_local;
  vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
  *points_local;
  ESoinn *this_local;
  
  pCVar1 = log_netw;
  local_30 = labels;
  labels_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)threshold_second_layer;
  threshold_second_layer_local._7_1_ = train_first_layer;
  pvStack_18 = points;
  points_local = (vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                  *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"trainOneEpoch function",&local_51);
  logger::ConcreteLogger::debug(pCVar1,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  for (local_84 = 0; uVar3 = (ulong)local_84,
      sVar4 = std::
              vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
              ::size(pvStack_18), uVar3 < sVar4; local_84 = local_84 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,&local_84);
  }
  local_90._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  _i_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_90,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )_i_1);
  local_9c = 1;
  for (local_a0 = 0; uVar3 = (ulong)local_a0,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80),
      this_01 = pvStack_18, uVar3 < sVar4; local_a0 = local_a0 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                        (ulong)local_a0);
    this_02 = &std::
               vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
               ::operator[](this_01,(ulong)*pvVar5)->
               super___shared_ptr<wv::AbstractWeightVector,_(__gnu_cxx::_Lock_policy)2>;
    p = std::__shared_ptr<wv::AbstractWeightVector,_(__gnu_cxx::_Lock_policy)2>::get(this_02);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_30);
    this_00 = local_30;
    local_c2 = 0;
    if (bVar2) {
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string((string *)&local_c0,"0",&local_c1);
    }
    else {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                          (ulong)local_a0);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)*pvVar5);
      std::__cxx11::string::string((string *)&local_c0,(string *)pvVar6);
    }
    processNewPoint(this,p,&local_c0,(bool)(threshold_second_layer_local._7_1_ & 1),
                    (double)labels_local);
    std::__cxx11::string::~string((string *)&local_c0);
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    pCVar1 = log_netw;
    if (local_9c % this->m_Lambda == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"iteration multiple lambda",&local_e9);
      logger::ConcreteLogger::debug(pCVar1,&local_e8,false);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      updateClassLabels(this);
      deleteEdgesDiffClasses(this);
      deleteNodes(this);
    }
    pCVar1 = log_netw;
    if (local_9c % 10000 == 0) {
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_1f0,"Iteration %d");
      pbVar7 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                         ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1f0,&local_9c);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                (&local_110,(basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar7
                );
      logger::ConcreteLogger::info(pCVar1,&local_110,false);
      std::__cxx11::string::~string((string *)&local_110);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_1f0);
    }
    local_9c = local_9c + 1;
  }
  deleteNodes(this);
  SealNeuronVector(this);
  pCVar1 = log_netw;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_2f0,"Network size = %d, number of empty neurons = %d");
  local_2f8 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons);
  pbVar7 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                     ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)&local_2f0,
                      &local_2f8);
  pbVar7 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                     ((basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar7,
                      &this->m_NumEmptyNeurons);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (&local_210,(basic_format<char,std::char_traits<char>,std::allocator<char>> *)pbVar7);
  logger::ConcreteLogger::info(pCVar1,&local_210,false);
  std::__cxx11::string::~string((string *)&local_210);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            (&local_2f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  return;
}

Assistant:

void ESoinn::trainOneEpoch(const std::vector<std::shared_ptr<wv::Point>>& points, bool train_first_layer, double threshold_second_layer, const std::vector<std::string>& labels)
    {
        log_netw->debug("trainOneEpoch function");
        //create vector with order of iterating by points
        std::vector<uint32_t> order;
        for (uint32_t i = 0; i < points.size(); i++)
            order.push_back(i);
        
        std::random_shuffle(order.begin(), order.end());
        uint32_t iteration = 1;

        for (uint32_t i = 0; i < order.size(); i++)
        {
            processNewPoint(points[order[i]].get(), (labels.empty()) ? "0" : labels[order[i]], train_first_layer, threshold_second_layer);
            if (iteration % m_Lambda == 0)
            {
                log_netw->debug("iteration multiple lambda");
                updateClassLabels();
                deleteEdgesDiffClasses();
                deleteNodes();
            }
            if (iteration % 10000 == 0)
                log_netw->info((boost::format("Iteration %d") % iteration).str());
            iteration++;
        }
        deleteNodes();
        SealNeuronVector();
        
        log_netw->info((boost::format("Network size = %d, number of empty neurons = %d") % m_Neurons.size() % m_NumEmptyNeurons).str());
    }